

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_reset_stream_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t in_RSI;
  quicly_conn_t *in_RDI;
  quicly_conn_t *_conn;
  int err;
  uint64_t bytes_missing;
  int ret;
  quicly_stream_t *stream;
  quicly_reset_stream_frame_t frame;
  quicly_reset_stream_frame_t *in_stack_ffffffffffffffa8;
  quicly_stream_t *stream_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  st_quicly_conn_t *in_stack_ffffffffffffffd0;
  ushort local_28;
  int in_stack_ffffffffffffffdc;
  quicly_stream_t *in_stack_ffffffffffffffe0;
  
  iVar1 = quicly_decode_reset_stream_frame
                    ((uint8_t **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = quicly_get_or_open_stream(in_RDI,in_RSI,(quicly_stream_t **)in_stack_ffffffffffffffe0);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_stack_ffffffffffffffc8 == (long *)0x0) {
    return 0;
  }
  iVar1 = quicly_recvstate_transfer_complete
                    ((quicly_recvstate_t *)(in_stack_ffffffffffffffc8 + 0xf));
  if (iVar1 == 0) {
    iVar1 = quicly_recvstate_reset
                      ((quicly_recvstate_t *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       &in_stack_ffffffffffffffa8->stream_id);
    if (iVar1 != 0) {
      return iVar1;
    }
    *(long *)(*in_stack_ffffffffffffffc8 + 0x550) =
         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8) +
         *(long *)(*in_stack_ffffffffffffffc8 + 0x550);
    iVar2 = local_28 + 0x30000;
    stream_00 = (quicly_stream_t *)*in_stack_ffffffffffffffc8;
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar3 = ptls_skip_tracing((ptls_t *)stream_00[7].recvstate.received._initial.end),
       iVar3 == 0)) {
      QUICLY_STREAM_ON_RECEIVE_RESET
                (in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8,
                 (st_quicly_stream_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
    }
    (**(code **)(in_stack_ffffffffffffffc8[2] + 0x28))(in_stack_ffffffffffffffc8,iVar2);
    if (2 < *(uint *)(*in_stack_ffffffffffffffc8 + 8)) {
      return 0xff06;
    }
    iVar1 = stream_is_destroyable(stream_00);
    if (iVar1 != 0) {
      destroy_stream(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
  }
  return 0;
}

Assistant:

static int handle_reset_stream_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_reset_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_reset_stream_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;

    if (!quicly_recvstate_transfer_complete(&stream->recvstate)) {
        uint64_t bytes_missing;
        if ((ret = quicly_recvstate_reset(&stream->recvstate, frame.final_size, &bytes_missing)) != 0)
            return ret;
        stream->conn->ingress.max_data.bytes_consumed += bytes_missing;
        int err = QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(frame.app_error_code);
        QUICLY_PROBE(STREAM_ON_RECEIVE_RESET, stream->conn, stream->conn->stash.now, stream, err);
        stream->callbacks->on_receive_reset(stream, err);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
        if (stream_is_destroyable(stream))
            destroy_stream(stream, 0);
    }

    return 0;
}